

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QDockWidgetGroupWindow::restore(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  DockOptions DVar2;
  QLayout *pQVar3;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo local_90;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QWidget::layout((QWidget *)this);
  this_00 = (QDockAreaLayoutInfo *)(pQVar3 + 8);
  bVar1 = QDockAreaLayoutInfo::isEmpty(this_00);
  if (!bVar1) {
    pQVar3 = QWidget::layout((QWidget *)this);
    QDockAreaLayoutInfo::operator=((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem,this_00);
    QDockAreaLayoutInfo::QDockAreaLayoutInfo(&local_90);
    QDockAreaLayoutInfo::operator=(this_00,&local_90);
    QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&local_90);
  }
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0xffffffffffffffff;
  QList<int>::clear((QList<int> *)(this + 0x38));
  adjustFlags(this);
  pQVar3 = QWidget::layout((QWidget *)this);
  QDockAreaLayoutInfo::fitItems((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem);
  pQVar3 = QWidget::layout((QWidget *)this);
  DVar2 = QMainWindow::dockOptions(*(QMainWindow **)(*(long *)(this + 8) + 0x10));
  QDockAreaLayoutInfo::apply
            ((QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem,
             (bool)((byte)DVar2.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                          super_QFlagsStorage<QMainWindow::DockOption>.i & 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::restore()
{
    QDockAreaLayoutInfo &savedState = static_cast<QDockWidgetGroupLayout *>(layout())->savedState;
    if (!savedState.isEmpty()) {
        *layoutInfo() = savedState;
        savedState = QDockAreaLayoutInfo();
    }
    currentGapRect = QRect();
    currentGapPos.clear();
    adjustFlags();
    layoutInfo()->fitItems();
    layoutInfo()->apply(static_cast<QMainWindow *>(parentWidget())->dockOptions()
                        & QMainWindow::AnimatedDocks);
}